

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

int Gia_SplitCofVar(Gia_Man_t *p,int LookAhead,int *pnFanouts,int *pnCost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *__ptr;
  Gia_Man_t *pGVar8;
  int iVar9;
  ulong uVar10;
  uint local_4c;
  
  if (LookAhead == 1) {
    iVar6 = Gia_SplitCofVar2(p,pnFanouts,pnCost);
    return iVar6;
  }
  __ptr = Gia_PermuteSpecialOrder(p);
  uVar7 = p->vCis->nSize - p->nRegs;
  if (LookAhead < (int)uVar7) {
    uVar7 = LookAhead;
  }
  if ((int)uVar7 < 1) {
    local_4c = 0xffffffff;
    iVar6 = 1000000000;
  }
  else {
    iVar6 = 1000000000;
    local_4c = 0xffffffff;
    uVar10 = 0;
    do {
      pGVar8 = Gia_ManDupCofactorVar(p,__ptr[uVar10],0);
      iVar9 = pGVar8->nObjs;
      iVar1 = pGVar8->vCis->nSize;
      iVar2 = pGVar8->vCos->nSize;
      Gia_ManStop(pGVar8);
      pGVar8 = Gia_ManDupCofactorVar(p,__ptr[uVar10],1);
      iVar3 = pGVar8->nObjs;
      iVar4 = pGVar8->vCis->nSize;
      iVar5 = pGVar8->vCos->nSize;
      Gia_ManStop(pGVar8);
      iVar9 = ((iVar9 + iVar3) - (iVar1 + iVar2 + iVar4 + iVar5)) + -2;
      if (iVar9 < iVar6) {
        local_4c = __ptr[uVar10];
        iVar6 = iVar9;
      }
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  if ((int)local_4c < 0) {
    __assert_fail("iBest >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                  ,0x105,"int Gia_SplitCofVar(Gia_Man_t *, int, int *, int *)");
  }
  iVar9 = p->vCis->nSize;
  if (iVar9 - p->nRegs <= (int)local_4c) {
    __assert_fail("v < Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
  }
  if (iVar9 <= (int)local_4c) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar9 = p->vCis->pArray[local_4c];
  if ((-1 < (long)iVar9) && (iVar9 < p->nObjs)) {
    *pnFanouts = p->pRefs[iVar9];
    *pnCost = iVar6;
    return local_4c;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_SplitCofVar( Gia_Man_t * p, int LookAhead, int * pnFanouts, int * pnCost )
{
    Gia_Man_t * pPart;
    int Cost0, Cost1, CostBest = ABC_INFINITY;
    int * pOrder, i, iBest = -1;
    if ( LookAhead == 1 )
        return Gia_SplitCofVar2( p, pnFanouts, pnCost );
    pOrder = Gia_PermuteSpecialOrder( p );
    LookAhead = Abc_MinInt( LookAhead, Gia_ManPiNum(p) );
    for ( i = 0; i < LookAhead; i++ )
    {
        pPart = Gia_ManDupCofactorVar( p, pOrder[i], 0 );
        Cost0 = Gia_ManAndNum(pPart);
        Gia_ManStop( pPart );

        pPart = Gia_ManDupCofactorVar( p, pOrder[i], 1 );
        Cost1 = Gia_ManAndNum(pPart);
        Gia_ManStop( pPart );

        if ( CostBest > Cost0 + Cost1 )
            CostBest = Cost0 + Cost1, iBest = pOrder[i];

/*
        pPart = Gia_ManDupExist( p, pOrder[i] );
        printf( "%2d : Var = %4d  Refs = %3d  %6d %6d -> %6d    %6d -> %6d\n", 
            i, pOrder[i], Gia_ObjRefNum(p, Gia_ManPi(p, pOrder[i])), 
            Cost0, Cost1, Cost0+Cost1, Gia_ManAndNum(p), Gia_ManAndNum(pPart) );
        Gia_ManStop( pPart );

        printf( "%2d : Var = %4d  Refs = %3d  %6d %6d -> %6d\n", 
            i, pOrder[i], Gia_ObjRefNum(p, Gia_ManPi(p, pOrder[i])), 
            Cost0, Cost1, Cost0+Cost1 );
*/
    }
    ABC_FREE( pOrder );
    assert( iBest >= 0 );
    *pnFanouts = Gia_ObjRefNum(p, Gia_ManPi(p, iBest));
    *pnCost = CostBest;
    return iBest;
}